

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O2

void write_sei_payload(h264_stream_t *h,bs_t *b)

{
  byte bVar1;
  sei_t *psVar2;
  long lVar3;
  
  psVar2 = h->sei;
  if (psVar2->payloadType == 0x18) {
    write_sei_scalability_info(h,b);
    return;
  }
  for (lVar3 = 0; lVar3 < psVar2->payloadSize; lVar3 = lVar3 + 1) {
    bVar1 = *(byte *)((long)((psVar2->field_2).sei_svc)->layers[0].roi + lVar3 + -0x4a);
    if ((b->bits_left == 8) && (b->p < b->end)) {
      *b->p = bVar1;
      b->p = b->p + 1;
    }
    else {
      bs_write_u(b,8,(uint)bVar1);
    }
  }
  return;
}

Assistant:

void write_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 0 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            write_sei_scalability_info( h, b );
            break;
        default:
            if( 0 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                bs_write_u8(b, s->data[i]);
    }
    
    //if( 0 )
    //    read_sei_end_bits(h, b);
}